

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

string * pystring::translate(string *__return_storage_ptr__,string *str,string *table,
                            string *deletechars)

{
  undefined1 uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  undefined1 *puVar5;
  char *pcVar6;
  ulong local_490;
  size_type i_3;
  size_type i_2;
  int iStack_478;
  int i_1;
  int trans_table [256];
  ulong local_70;
  size_type i;
  size_type dellen;
  size_type len;
  string s;
  string *deletechars_local;
  string *table_local;
  string *str_local;
  
  s.field_2._8_8_ = deletechars;
  std::__cxx11::string::string((string *)&len);
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 0x100) {
    if (uVar3 == 0) {
      std::__cxx11::string::operator=((string *)&len,(string *)str);
      for (local_70 = 0; local_70 < uVar2; local_70 = local_70 + 1) {
        std::__cxx11::string::operator[]((ulong)&len);
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)table);
        uVar1 = *puVar5;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&len);
        *puVar5 = uVar1;
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&len);
    }
    else {
      for (i_2._4_4_ = 0; i_2._4_4_ < 0x100; i_2._4_4_ = i_2._4_4_ + 1) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)table);
        (&iStack_478)[i_2._4_4_] = (int)*pcVar6;
      }
      for (i_3 = 0; i_3 < uVar3; i_3 = i_3 + 1) {
        pcVar6 = (char *)std::__cxx11::string::operator[](s.field_2._8_8_);
        (&iStack_478)[(int)*pcVar6] = -1;
      }
      for (local_490 = 0; local_490 < uVar2; local_490 = local_490 + 1) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)str);
        if ((&iStack_478)[(int)*pcVar6] != -1) {
          std::__cxx11::string::operator[]((ulong)str);
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)table);
          std::__cxx11::string::operator+=((string *)&len,*pcVar6);
        }
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&len);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  std::__cxx11::string::~string((string *)&len);
  return __return_storage_ptr__;
}

Assistant:

std::string translate( const std::string & str, const std::string & table, const std::string & deletechars )
    {
        std::string s;
        std::string::size_type len = str.size(), dellen = deletechars.size();

        if ( table.size() != 256 )
        {
            // TODO : raise exception instead
            return str;
        }

        //if nothing is deleted, use faster code
        if ( dellen == 0 )
        {
            s = str;
            for ( std::string::size_type i = 0; i < len; ++i )
            {
                s[i] = table[ s[i] ];
            }
            return s;
        }


        int trans_table[256];
        for ( int i = 0; i < 256; i++)
        {
            trans_table[i] = table[i];
        }

        for ( std::string::size_type i = 0; i < dellen; i++)
        {
            trans_table[(int) deletechars[i] ] = -1;
        }

        for ( std::string::size_type i = 0; i < len; ++i )
        {
            if ( trans_table[ (int) str[i] ] != -1 )
            {
                s += table[ str[i] ];
            }
        }

        return s;

    }